

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t>::
~alloca_destructor(alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t> *this)

{
  busy_block_t *pbVar1;
  
  if ((0x200 < (this->objects).m_len) &&
     (pbVar1 = (this->objects).m_ptr, pbVar1 != (busy_block_t *)0x0)) {
    operator_delete__(pbVar1);
    return;
  }
  return;
}

Assistant:

~alloca_destructor()
	{
		if (objects.size() > cutoff)
		{
			delete [] objects.data();
		}
		else
		{
			for (auto& o : objects)
			{
				TORRENT_UNUSED(o);
				o.~T();
			}
		}
	}